

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

BinaryBinsSelectExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinaryBinsSelectExprSyntax,slang::syntax::BinsSelectExpressionSyntax&,slang::parsing::Token,slang::syntax::BinsSelectExpressionSyntax&>
          (BumpAllocator *this,BinsSelectExpressionSyntax *args,Token *args_1,
          BinsSelectExpressionSyntax *args_2)

{
  Token op;
  BinaryBinsSelectExprSyntax *pBVar1;
  BinsSelectExpressionSyntax *in_RCX;
  BumpAllocator *in_RDX;
  BinaryBinsSelectExprSyntax *in_RSI;
  undefined8 in_RDI;
  Info *unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  
  pBVar1 = (BinaryBinsSelectExprSyntax *)allocate(in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8);
  op.info = unaff_retaddr;
  op.kind = (short)in_RDI;
  op._2_1_ = (char)((ulong)in_RDI >> 0x10);
  op.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  op.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::BinaryBinsSelectExprSyntax::BinaryBinsSelectExprSyntax
            (in_RSI,(BinsSelectExpressionSyntax *)in_RDX,op,in_RCX);
  return pBVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }